

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_reduce_scatter_
               (void *sendbuf,void *recvbuf,int *recvcounts,MPIABI_Fint *datatype,MPIABI_Fint *op,
               MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_reduce_scatter_();
  return;
}

Assistant:

void mpiabi_reduce_scatter_(
  const void * sendbuf,
  void * recvbuf,
  const int * recvcounts,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * op,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_reduce_scatter_(
    sendbuf,
    recvbuf,
    recvcounts,
    datatype,
    op,
    comm,
    ierror
  );
}